

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O0

bool __thiscall
QStringListModel::moveRows
          (QStringListModel *this,QModelIndex *sourceParent,int sourceRow,int count,
          QModelIndex *destinationParent,int destinationChild)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  int in_EDX;
  undefined8 in_RSI;
  QModelIndex *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  int fromRow;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int destinationChild_00;
  QModelIndex *sourceParent_00;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < in_EDX) {
    iVar3 = in_EDX + in_ECX + -1;
    sourceParent_00 = in_RDI;
    iVar4 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_RSI);
    if ((iVar3 < iVar4) && (-1 < in_R9D)) {
      iVar4 = in_R9D;
      iVar5 = (**(code **)(*(long *)in_RDI + 0x78))(in_RDI,in_R8);
      destinationChild_00 = (int)((ulong)in_R8 >> 0x20);
      if (((iVar4 <= iVar5) && (((in_EDX != in_R9D && (in_EDX != in_R9D + -1)) && (0 < in_ECX)))) &&
         ((bVar2 = QModelIndex::isValid
                             ((QModelIndex *)
                              CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)), !bVar2
          && (bVar2 = QModelIndex::isValid
                                ((QModelIndex *)
                                 CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)),
             !bVar2)))) {
        QModelIndex::QModelIndex((QModelIndex *)0x8bb761);
        iVar6 = in_EDX + in_ECX + -1;
        iVar5 = in_EDX;
        QModelIndex::QModelIndex((QModelIndex *)0x8bb782);
        bVar2 = QAbstractItemModel::beginMoveRows
                          ((QAbstractItemModel *)
                           CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                           sourceParent_00,(int)((ulong)in_RSI >> 0x20),(int)in_RSI,
                           (QModelIndex *)CONCAT44(iVar5,in_ECX),destinationChild_00);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          while (iVar5 = in_ECX + -1, in_ECX != 0) {
            QList<QString>::move
                      ((QList<QString> *)in_RDI,CONCAT44(iVar3,iVar4),CONCAT44(iVar6,in_EDX));
            in_ECX = iVar5;
          }
          QAbstractItemModel::endMoveRows((QAbstractItemModel *)sourceParent_00);
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
        goto LAB_008bb81d;
      }
    }
  }
  bVar2 = false;
LAB_008bb81d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::moveRows(const QModelIndex &sourceParent, int sourceRow, int count, const QModelIndex &destinationParent, int destinationChild)
{
    if (sourceRow < 0
        || sourceRow + count - 1 >= rowCount(sourceParent)
        || destinationChild < 0
        || destinationChild > rowCount(destinationParent)
        || sourceRow == destinationChild
        || sourceRow == destinationChild - 1
        || count <= 0
        || sourceParent.isValid()
        || destinationParent.isValid()) {
        return false;
    }
    if (!beginMoveRows(QModelIndex(), sourceRow, sourceRow + count - 1, QModelIndex(), destinationChild))
        return false;

    int fromRow = sourceRow;
    if (destinationChild < sourceRow)
        fromRow += count - 1;
    else
        destinationChild--;
    while (count--)
        lst.move(fromRow, destinationChild);
    endMoveRows();
    return true;
}